

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  if (column->SortOrder == -1) {
    bVar1 = column->SortDirectionsAvailList;
LAB_002341d9:
    uVar3 = bVar1 & 3;
  }
  else {
    bVar1 = 1;
    iVar2 = 0;
    do {
      if ((column->SortDirectionsAvailList >> ((byte)iVar2 & 0x1f) & 3) == (column->field_0x65 & 3))
      {
        bVar1 = column->SortDirectionsAvailList >>
                (bVar1 % ((byte)column->field_0x65 >> 2 & 3)) * '\x02';
        goto LAB_002341d9;
      }
      bVar1 = bVar1 + 1;
      iVar2 = iVar2 + 2;
    } while (iVar2 != 6);
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}